

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::StrPair::ParseName(StrPair *this,char *p)

{
  bool bVar1;
  StrPair *in_RSI;
  char *in_RDI;
  char *start;
  int in_stack_ffffffffffffffcc;
  uint7 in_stack_ffffffffffffffd0;
  char *local_18;
  char *local_8;
  
  if ((in_RSI == (StrPair *)0x0) || ((char)in_RSI->_flags == '\0')) {
    local_8 = (char *)0x0;
  }
  else {
    bVar1 = XMLUtil::IsNameStartChar('\0');
    if (bVar1) {
      local_18 = (char *)((long)&in_RSI->_flags + 1);
      while( true ) {
        bVar1 = false;
        if (*local_18 != '\0') {
          bVar1 = XMLUtil::IsNameChar('\0');
        }
        if (bVar1 == false) break;
        local_18 = local_18 + 1;
      }
      Set(in_RSI,in_RDI,(char *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      local_8 = local_18;
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char* StrPair::ParseName( char* p )
{
    if ( !p || !(*p) ) {
        return 0;
    }
    if ( !XMLUtil::IsNameStartChar( *p ) ) {
        return 0;
    }

    char* const start = p;
    ++p;
    while ( *p && XMLUtil::IsNameChar( *p ) ) {
        ++p;
    }

    Set( start, p, 0 );
    return p;
}